

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  ushort uVar1;
  uint num_rects;
  ImFontAtlasCustomRect *pIVar2;
  long lVar3;
  ulong uVar4;
  char *__function;
  uint uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  ImVector<stbrp_rect> pack_rects;
  stbrp_rect *psStack_30;
  
  if (stbrp_context_opaque == (void *)0x0) {
    __assert_fail("pack_context != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x8b7,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  num_rects = (atlas->CustomRects).Size;
  if ((int)num_rects < 1) {
    __assert_fail("user_rects.Size >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                  ,0x8ba,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  psStack_30 = (stbrp_rect *)0x0;
  if (0 < (int)num_rects) {
    uVar5 = 8;
    if (7 < (int)num_rects) {
      uVar5 = num_rects;
    }
    if (0 < (int)uVar5) {
      psStack_30 = (stbrp_rect *)ImGui::MemAlloc((ulong)uVar5 << 4);
    }
  }
  uVar8 = 0;
  memset(psStack_30,0,(ulong)(num_rects << 4));
  lVar3 = (long)(atlas->CustomRects).Size;
  if (0 < lVar3) {
    uVar4 = (ulong)num_rects;
    if ((int)num_rects < 1) {
      uVar4 = uVar8;
    }
    do {
      if (uVar4 * 0x10 == uVar8) goto LAB_001566e6;
      *(undefined4 *)((long)&psStack_30->w + uVar8) =
           *(undefined4 *)(&((atlas->CustomRects).Data)->Width + uVar8);
      uVar8 = uVar8 + 0x10;
    } while (lVar3 * 0x10 != uVar8);
  }
  if ((int)num_rects < 1) {
LAB_001566e6:
    __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
LAB_00156712:
    __assert_fail("i < Size",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.h"
                  ,0x52e,__function);
  }
  stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,psStack_30,num_rects);
  if (0 < (long)(int)num_rects) {
    lVar3 = 0xc;
    lVar6 = 0;
    do {
      if (*(int *)((long)&psStack_30->id + lVar3) != 0) {
        if ((atlas->CustomRects).Size <= lVar6) {
          __function = 
          "T &ImVector<ImFontAtlasCustomRect>::operator[](int) [T = ImFontAtlasCustomRect]";
          goto LAB_00156712;
        }
        pIVar2 = (atlas->CustomRects).Data;
        uVar5 = *(uint *)((long)psStack_30 + lVar3 + -4);
        *(uint *)((long)pIVar2 + lVar3 * 2 + -0x14) = uVar5;
        if ((*(short *)((long)psStack_30 + lVar3 + -8) !=
             *(short *)((long)pIVar2 + lVar3 * 2 + -0x18)) ||
           (uVar1 = *(ushort *)((long)psStack_30 + lVar3 + -6),
           uVar1 != *(ushort *)((long)pIVar2 + lVar3 * 2 + -0x16))) {
          __assert_fail("pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui_draw.cpp"
                        ,0x8ca,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
        }
        iVar7 = (uint)uVar1 + (uVar5 >> 0x10);
        if (iVar7 < atlas->TexHeight) {
          iVar7 = atlas->TexHeight;
        }
        atlas->TexHeight = iVar7;
      }
      lVar6 = lVar6 + 1;
      lVar3 = lVar3 + 0x10;
    } while ((int)num_rects != lVar6);
  }
  if (psStack_30 != (stbrp_rect *)0x0) {
    ImGui::MemFree(psStack_30);
  }
  return;
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = pack_rects[i].x;
            user_rects[i].Y = pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}